

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O0

target_ulong_conflict
helper_extr_r_w_mips
          (target_ulong_conflict ac,target_ulong_conflict shift,CPUMIPSState_conflict *env)

{
  ulong local_28;
  int64_t tempDL [2];
  CPUMIPSState_conflict *env_local;
  target_ulong_conflict shift_local;
  target_ulong_conflict ac_local;
  
  tempDL[1] = (int64_t)env;
  mipsdsp_rndrashift_short_acc((int64_t *)&local_28,ac,shift & 0x1f,env);
  if (((tempDL[0] != 0) || ((local_28 & 0xffffffff00000000) != 0)) &&
     ((tempDL[0] != 1 || ((local_28 & 0xffffffff00000000) != 0xffffffff00000000)))) {
    set_DSPControl_overflow_flag(1,0x17,(CPUMIPSState_conflict *)tempDL[1]);
  }
  local_28 = local_28 + 1;
  if (local_28 == 0) {
    tempDL[0] = tempDL[0] + 1;
  }
  if ((((tempDL[0] & 1U) != 0) || ((local_28 & 0xffffffff00000000) != 0)) &&
     (((tempDL[0] & 1U) != 1 || ((local_28 & 0xffffffff00000000) != 0xffffffff00000000)))) {
    set_DSPControl_overflow_flag(1,0x17,(CPUMIPSState_conflict *)tempDL[1]);
  }
  return (target_ulong_conflict)((long)local_28 >> 1);
}

Assistant:

target_ulong helper_extr_r_w(target_ulong ac, target_ulong shift,
                             CPUMIPSState *env)
{
    int64_t tempDL[2];

    shift = shift & 0x1F;

    mipsdsp_rndrashift_short_acc(tempDL, ac, shift, env);
    if ((tempDL[1] != 0 || (tempDL[0] & MIPSDSP_LHI) != 0) &&
        (tempDL[1] != 1 || (tempDL[0] & MIPSDSP_LHI) != MIPSDSP_LHI)) {
        set_DSPControl_overflow_flag(1, 23, env);
    }

    tempDL[0] += 1;
    if (tempDL[0] == 0) {
        tempDL[1] += 1;
    }

    if (((tempDL[1] & 0x01) != 0 || (tempDL[0] & MIPSDSP_LHI) != 0) &&
        ((tempDL[1] & 0x01) != 1 || (tempDL[0] & MIPSDSP_LHI) != MIPSDSP_LHI)) {
        set_DSPControl_overflow_flag(1, 23, env);
    }

    return (target_long)(int32_t)(tempDL[0] >> 1);
}